

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O3

EC_T_DWORD
EtherCATStack(CAtEmLogging *poLog,EC_T_CNF_TYPE eCnfType,EC_T_PBYTE pbyCnfData,
             EC_T_DWORD dwCnfDataLen,EC_T_DWORD dwBusCycleTimeUsec,EC_T_INT nVerbose,
             EC_T_DWORD dwDuration,EC_T_LINK_PARMS *poLinkParms,void *pvTimingEvent,
             EC_T_DWORD dwCpuIndex,EC_T_BOOL bEnaPerfJobs,EC_T_WORD wServerPort,
             EC_T_LINK_PARMS *poLinkParmsRed,EC_T_OS_PARMS *poOsParms,EC_T_DCM_MODE eDcmMode,
             EC_T_BOOL bDcmCtlOff,_func_void_EC_T_BYTE_ptr_EC_T_BYTE_ptr *callbackFctPtr,
             char *licenseKey)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CEmNotification *pCVar5;
  undefined8 uVar6;
  size_t sVar7;
  char *pcVar8;
  CAtEmLogging *pCVar9;
  EC_T_INT nVerbose_00;
  char *pcVar10;
  EC_T_TSC_MEAS_DESC *poLog_00;
  ulong uVar11;
  EC_T_PBYTE puVar12;
  char cVar13;
  bool bVar14;
  EC_T_INT nDiffAvg;
  EC_T_DCM_CONFIG oDcmConfig;
  CEcTimer oTimeout;
  CEcTimer oDcmStatusTimer;
  uint local_174;
  uint local_170;
  uint local_16c;
  CEmNotification *local_168;
  EC_T_PBYTE local_160;
  uint local_154;
  EC_T_DWORD local_150;
  EC_T_CNF_TYPE local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 local_110;
  EC_T_BOOL EStack_108;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined4 uStack_fc;
  undefined3 uStack_f8;
  EC_T_INT EStack_f5;
  undefined1 uStack_f1;
  undefined7 local_f0;
  undefined1 uStack_e9;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined1 local_b8 [40];
  EC_T_DWORD local_90;
  uint uStack_8c;
  EC_T_DWORD aEStack_88 [8];
  CEmNotification *local_68;
  code *pcStack_60;
  EC_T_DWORD EStack_58;
  CEcTimer local_50 [24];
  byte local_38;
  
  callbackFct = callbackFctPtr;
  local_160 = pbyCnfData;
  local_150 = dwCnfDataLen;
  local_14c = eCnfType;
  CEcTimer::CEcTimer((CEcTimer *)local_b8);
  CEcTimer::CEcTimer(local_50);
  S_bEnaPerfJobs = bEnaPerfJobs;
  S_DemoThreadParam.pvTimingEvent = pvTimingEvent;
  S_poLog = poLog;
  CAtEmLogging::LogMsg(poLog,"nVerbose: %d\n",(ulong)(uint)nVerbose);
  if (poLinkParms->eLinkMode != EcLinkMode_POLLING) {
    CAtEmLogging::LogError
              (S_poLog,
               "Error: Link layer in \'interrupt\' mode is not supported by EcMasterDemoDc. Please select \'polling\' mode."
              );
LAB_001446b6:
    pCVar5 = (CEmNotification *)0x0;
    uVar2 = 0x9811000b;
    goto LAB_001446bc;
  }
  iVar1 = OsSetThreadAffinity(0,1 << ((byte)dwCpuIndex & 0x1f));
  if (iVar1 == 0) {
    CAtEmLogging::LogError
              (S_poLog,"Error: Set thread affinitiy, invalid CPU index %d\n",(ulong)dwCpuIndex);
    goto LAB_001446b6;
  }
  pCVar5 = (CEmNotification *)operator_new(0x7768,(nothrow_t *)&std::nothrow);
  if (pCVar5 == (CEmNotification *)0x0) {
    uVar2 = 0x9811000a;
    pCVar5 = (CEmNotification *)0x0;
    goto LAB_001446bc;
  }
  CEmNotification::CEmNotification(pCVar5,0,poLog,0);
  pCVar5->m_nVerbosePrinting = nVerbose;
  local_168 = pCVar5;
  if (S_bEnaPerfJobs != 0) {
    ecatPerfMeasInit(&S_TscMeasDesc,0,7,0);
    ecatPerfMeasEnable(&S_TscMeasDesc);
  }
  S_dwAppFoundSlaves = 0;
  memset(S_aSlaveList,0,0x4d8);
  S_dwSlaveIdx14 = 0xffff;
  S_dwSlaveIdx24 = 0xffff;
  S_dwSlaveIdx4132 = 0xffff;
  S_dwSlaveIdxETCio100 = 0xffff;
  if (wServerPort != 0xffff) {
    if (nVerbose != 0) {
      CAtEmLogging::LogMsg(S_poLog,"Start Remote API Server now\n");
    }
    local_90 = 0;
    uStack_8c = (uint)wServerPort;
    aEStack_88[0] = 2;
    aEStack_88[1] = 5000;
    aEStack_88[2] = 6000;
    aEStack_88[3] = 0x27;
    aEStack_88[4] = 0x27;
    aEStack_88[5] = 100;
    aEStack_88[6] = 0x32;
    aEStack_88[7] = 3000;
    local_68 = local_168;
    pcStack_60 = RasNotifyWrapper;
    EStack_58 = 500;
    iVar1 = emRasSrvStart(&S_pvRemoteApiSrvH);
    if (iVar1 != 0) {
      CAtEmLogging::LogError(S_poLog,"ERROR: Cannot spawn Remote API Server\n");
    }
    S_bRasSrvStarted = '\x01';
  }
  if (nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"==========================");
    CAtEmLogging::LogMsg(S_poLog,"Initialize EtherCAT Master");
    CAtEmLogging::LogMsg(S_poLog,"==========================");
  }
  EStack_108 = 0;
  uStack_fc = 0;
  uStack_f8 = 0;
  uStack_e9 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  local_148 = 0x78aec29106;
  local_128 = CONCAT44(0x100,dwBusCycleTimeUsec);
  uStack_120 = 0x20;
  uStack_118 = CONCAT44((999 < dwBusCycleTimeUsec) + 1 + (uint)(999 < dwBusCycleTimeUsec),0x20);
  local_110 = 0x500000000;
  uStack_104 = 1000;
  uStack_102 = 0;
  uStack_100 = 0xfa;
  uStack_fe = 0;
  uStack_f1 = 0xd6;
  local_f0 = 0x14ee;
  EStack_f5 = nVerbose;
  local_138 = poLinkParms;
  uStack_130 = poLinkParmsRed;
  uStack_140 = poOsParms;
  uVar2 = emInitMaster(0);
  pCVar9 = S_poLog;
  if (uVar2 != 0) {
    uVar6 = ecatGetText(uVar2);
    CAtEmLogging::LogError
              (pCVar9,"Cannot initialize EtherCAT-Master! (Result = %s 0x%x)",uVar6,(ulong)uVar2);
    pCVar5 = local_168;
    goto LAB_001446bc;
  }
  sVar7 = strlen(licenseKey);
  pCVar5 = local_168;
  if (1 < sVar7) {
    CAtEmLogging::LogMsg(S_poLog,"LicenseKey: %s",licenseKey);
    uVar2 = emSetLicenseKey(0,licenseKey);
    if (uVar2 == 0) {
      CAtEmLogging::LogMsg(S_poLog,"ACTIVATION SUCCESSFULL");
    }
    else {
      local_b8._32_8_ = S_poLog;
      uVar6 = ecatGetText(uVar2);
      CAtEmLogging::LogError
                ((CAtEmLogging *)local_b8._32_8_,"ACTIVATION FAILED (Result = %s 0x%x)",uVar6,
                 (ulong)uVar2);
    }
  }
  S_DemoThreadParam.bJobThreadRunning = 0;
  S_DemoThreadParam.bJobThreadShutdown = 0;
  S_DemoThreadParam.pLogInst = S_poLog;
  S_DemoThreadParam.pNotInst = pCVar5;
  S_DemoThreadParam.dwCpuIndex = dwCpuIndex;
  S_DemoThreadParam.dwBusCycleTimeUsec = dwBusCycleTimeUsec;
  S_pvtJobThread =
       (EC_T_PVOID)OsCreateThread("tEcJobTask",tEcJobTask,0x62,0x4000,&S_DemoThreadParam);
  CEcTimer::Start((CEcTimer *)local_b8,2000);
  iVar1 = CEcTimer::IsElapsed((CEcTimer *)local_b8);
  bVar14 = S_DemoThreadParam.bJobThreadRunning == 0;
  if (iVar1 == 0 && bVar14) {
    do {
      LinuxSleep(10);
      iVar1 = CEcTimer::IsElapsed((CEcTimer *)local_b8);
      bVar14 = S_DemoThreadParam.bJobThreadRunning == 0;
    } while (iVar1 == 0 && bVar14);
  }
  if (bVar14) {
    CAtEmLogging::LogError(S_poLog,"Timeout starting JobTask");
    uVar2 = 0x98110010;
    goto LAB_001446bc;
  }
  CEcTimer::Stop((CEcTimer *)local_b8);
  puVar12 = local_160;
  uVar2 = emConfigureMaster(0,local_14c,local_160,local_150);
  pCVar9 = S_poLog;
  if (uVar2 != 0) {
    uVar6 = ecatGetText(uVar2);
    pcVar10 = "Cannot configure EtherCAT-Master! %s (Result = 0x%x)";
    goto LAB_00144a67;
  }
  if (puVar12 == (EC_T_PBYTE)0x0) goto LAB_00144d2f;
  uStack_130._0_4_ = 0;
  uStack_130._4_4_ = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_148 = 0x2ee000000000;
  uStack_140._0_4_ = 0xd;
  uStack_140._4_4_ = 0x5dc;
  local_138._0_4_ = 10000;
  if (eDcmMode == eDcmMode_MasterRefClock) {
    local_138._4_4_ = 1;
LAB_00144ae5:
    uStack_130._4_4_ = 1;
  }
  else {
    local_138._4_4_ = 0xc;
    if (dwBusCycleTimeUsec < 1000) {
      local_138._4_4_ = 6;
    }
    if (eDcmMode != eDcmMode_Dcx) goto LAB_00144ae5;
  }
  uVar2 = emDcConfigure(0);
  if (uVar2 != 0) {
    pcVar10 = "Cannot configure DC! (Result = 0x%x)";
    goto LAB_00144d64;
  }
  bVar14 = 2 < pCVar5->m_nVerbosePrinting;
  if (bDcmCtlOff != 0 && nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"DCM control loop disabled for diagnosis!\n");
  }
  memset(&local_148,0,0x88);
  if (eDcmMode_Dcx < eDcmMode) {
switchD_00144b99_caseD_3:
    CAtEmLogging::LogError(S_poLog,"DCM mode is not supported!");
    uVar2 = 0x98110001;
    pCVar5 = local_168;
    goto LAB_00144d6e;
  }
  iVar1 = ((dwBusCycleTimeUsec * 2) / 3) * 1000;
  uVar2 = (uint)bVar14;
  switch(eDcmMode) {
  case eDcmMode_BusShift:
    local_148._0_4_ = 1;
    goto LAB_00144bd2;
  case eDcmMode_MasterShift:
    local_148._0_4_ = 2;
LAB_00144bd2:
    local_148 = CONCAT44(iVar1,(EC_T_DWORD)local_148);
    uStack_130._0_4_ = (dwBusCycleTimeUsec * 1000) / 5;
    local_128 = CONCAT44(local_128._4_4_,bDcmCtlOff);
    local_138._4_4_ = uVar2;
    break;
  case eDcmMode_LinkLayerRefClock:
    goto switchD_00144b99_caseD_3;
  case eDcmMode_MasterRefClock:
    local_148 = CONCAT44(iVar1,4);
    uStack_140._0_4_ = uVar2;
    break;
  case eDcmMode_Dcx:
    local_148 = CONCAT44(iVar1,5);
    uStack_130._0_4_ = (dwBusCycleTimeUsec * 1000) / 5;
    local_128 = CONCAT44(iVar1,bDcmCtlOff);
    local_110 = CONCAT44(local_110._4_4_,(dwBusCycleTimeUsec * 1000) / 0x32);
    uStack_118 = (ulong)CONCAT14(bVar14,(undefined4)uStack_118);
    EStack_108 = bDcmCtlOff;
    uStack_102 = 1000;
    uStack_100 = 0;
    uStack_104 = 0;
    local_138._4_4_ = uVar2;
  }
  uVar2 = emDcmConfigure(0,&local_148,0);
  pCVar5 = local_168;
  pCVar9 = S_poLog;
  if (uVar2 != 0) {
    if (uVar2 == 0x9811001c) {
      CAtEmLogging::LogError(S_poLog,"Cannot configure DCM mode!");
      CAtEmLogging::LogError
                (S_poLog,
                 "Start with -dcmmode off to run the DC demo without DCM, or prepare the ENI file to support the requested DCM mode"
                );
      CAtEmLogging::LogError
                (S_poLog,
                 "In ET9000 for example, select under Advanced settings\\Distributed clocks DC in use and Slave Mode"
                );
      CAtEmLogging::LogError(S_poLog,"to support BusShift and MasterRefClock modes.");
      CAtEmLogging::LogError(S_poLog,"Please refer to the class A manual for further information");
      uVar2 = 0x9811001c;
    }
    else {
      uVar6 = ecatGetText(uVar2);
      pcVar10 = "Cannot configure DCM mode! %s (Result = 0x%x)";
LAB_00144a67:
      CAtEmLogging::LogError(pCVar9,pcVar10,uVar6,(ulong)uVar2);
    }
    goto LAB_001446bc;
  }
LAB_00144d2f:
  local_138._0_4_ = 0;
  local_138._4_4_ = 0;
  uStack_130._0_4_ = 0;
  local_148 = 0;
  uStack_140._0_4_ = 0;
  uStack_140._4_4_ = 0;
  uVar2 = emRegisterClient(0,ecatNotifyCallback,pCVar5);
  if (uVar2 != 0) {
    pcVar10 = "Cannot register client! (Result = 0x%x)";
LAB_00144d64:
    CAtEmLogging::LogError(S_poLog,pcVar10,(ulong)uVar2);
    goto LAB_00144d6e;
  }
  S_dwClntId = (EC_T_DWORD)local_148;
  pCVar5->m_dwClientID = (EC_T_DWORD)local_148;
  if (nVerbose < 2) {
    puVar12 = local_160;
    if (nVerbose == 1) goto LAB_00144e1c;
    if (nVerbose != 0) goto LAB_00144e7f;
  }
  else {
    uVar2 = emScanBus(0,5000);
    puVar12 = local_160;
    pCVar9 = S_poLog;
    if (((uVar2 == 0x9811001e) || (uVar2 == 0)) || (uVar2 == 0x9811017b)) {
      PrintSlaveInfos(0,poLog);
    }
    else {
      uVar6 = ecatGetText(uVar2);
      CAtEmLogging::LogError(pCVar9,"Cannot scan bus: %s (0x%lx)",uVar6,(ulong)uVar2);
    }
LAB_00144e1c:
    uVar2 = emGetSrcMacAddress(0,&local_148);
    if (uVar2 != 0) {
      CAtEmLogging::LogError(S_poLog,"Cannot get MAC address! (Result = 0x%x)",(ulong)uVar2);
    }
    CAtEmLogging::LogMsg
              (S_poLog,"EtherCAT network adapter MAC: %02X-%02X-%02X-%02X-%02X-%02X\n",
               local_148 & 0xff,local_148 >> 8 & 0xff,local_148 >> 0x10 & 0xff,
               local_148 >> 0x18 & 0xff,(uint)local_148._4_1_,(uint)local_148._5_1_);
LAB_00144e7f:
    CAtEmLogging::LogMsg(S_poLog,"=====================");
    CAtEmLogging::LogMsg(S_poLog,"Start EtherCAT Master");
    CAtEmLogging::LogMsg(S_poLog,"=====================");
  }
  nVerbose_00 = 15000;
  uVar2 = emSetMasterState(0,15000,1);
  uVar11 = (ulong)uVar2;
  CEmNotification::ProcessNotificationJobs(pCVar5);
  pCVar9 = S_poLog;
  if (uVar2 == 0) {
    myAppPrepare(poLog,nVerbose_00);
    pcVar10 = (char *)0x3a98;
    uVar2 = emSetMasterState(0,15000,2);
    uVar11 = (ulong)uVar2;
    poLog_00 = (EC_T_TSC_MEAS_DESC *)pCVar5;
    CEmNotification::ProcessNotificationJobs(pCVar5);
    pCVar9 = S_poLog;
    if (uVar2 != 0) {
      uVar6 = ecatGetText(uVar2);
      pcVar10 = "Cannot start set master state to PREOP (Result = %s (0x%lx))";
      goto LAB_00144f35;
    }
    if (puVar12 == (EC_T_PBYTE)0x0) {
      if (nVerbose != 0) {
        pcVar10 = "No ENI file provided. EC-Master started with generated ENI file.";
        poLog_00 = (EC_T_TSC_MEAS_DESC *)S_poLog;
        CAtEmLogging::LogMsg
                  (S_poLog,"No ENI file provided. EC-Master started with generated ENI file.");
      }
LAB_00145068:
      if (S_bEnaPerfJobs != 0) {
        CAtEmLogging::LogMsg(S_poLog,"");
        pCVar9 = S_poLog;
        iVar1 = emGetMasterState(0);
        uVar2 = iVar1 - 1;
        if ((uVar2 < 8) && ((0x8fU >> (uVar2 & 0x1f) & 1) != 0)) {
          pcVar10 = (&PTR_anon_var_dwarf_d20_0023e180)[uVar2];
        }
        else {
          pcVar10 = "STATE INVALID";
          if (iVar1 == 0) {
            pcVar10 = "UNKNOWN";
          }
        }
        CAtEmLogging::LogMsg(pCVar9,"Job times during startup <INIT> to <%s>:",pcVar10);
        ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
        CAtEmLogging::LogMsg(S_poLog,"");
        poLog_00 = &S_TscMeasDesc;
        pcVar10 = (char *)0xffffffff;
        ecatPerfMeasReset();
        pCVar5 = local_168;
        puVar12 = local_160;
      }
      if (dwDuration != 0) {
        poLog_00 = (EC_T_TSC_MEAS_DESC *)local_b8;
        pcVar10 = (char *)(ulong)dwDuration;
        CEcTimer::Start((CEcTimer *)poLog_00,dwDuration);
      }
      if (bRun != 0) {
        local_150 = CONCAT31(local_150._1_3_,nVerbose < 3);
        local_160 = (EC_T_PBYTE)CONCAT44(local_160._4_4_,1);
        do {
          if ((local_b8[0x18] & 1) != 0) {
            poLog_00 = (EC_T_TSC_MEAS_DESC *)local_b8;
            iVar1 = CEcTimer::IsElapsed((CEcTimer *)poLog_00);
            if (iVar1 != 0) break;
          }
          if (1 < nVerbose) {
            poLog_00 = &S_TscMeasDesc;
            pcVar10 = (char *)0xffffffff;
            ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
          }
          bRun = 1;
          myAppDiagnosis((CAtEmLogging *)poLog_00,(EC_T_INT)pcVar10);
          if (eDcmMode != eDcmMode_Off && puVar12 != (EC_T_PBYTE)0x0) {
            local_174 = 0;
            local_16c = 0;
            local_170 = 0;
            local_154 = 0;
            if (((local_38 & 1) == 0) || (iVar1 = CEcTimer::IsElapsed(local_50), iVar1 != 0)) {
              CEcTimer::Start(local_50,5000);
              cVar13 = (char)local_150;
            }
            else {
              cVar13 = '\x01';
            }
            pcVar10 = (char *)&local_174;
            uVar2 = emDcmGetStatus(0,pcVar10,&local_16c,&local_170,&local_154);
            pCVar9 = S_poLog;
            if (uVar2 == 0) {
              if ((int)local_160 != 0) {
                iVar1 = emGetMasterState(0);
                uVar2 = iVar1 - 1;
                if ((uVar2 < 8) && ((0x8fU >> (uVar2 & 0x1f) & 1) != 0)) {
                  pcVar8 = (&PTR_anon_var_dwarf_d20_0023e180)[uVar2];
                }
                else {
                  pcVar8 = "STATE INVALID";
                  if (iVar1 == 0) {
                    pcVar8 = "UNKNOWN";
                  }
                }
                pcVar10 = "DCM during startup (<INIT> to <%s>)";
                CAtEmLogging::LogMsg(pCVar9,"DCM during startup (<INIT> to <%s>)",pcVar8);
              }
              pCVar9 = S_poLog;
              if ((1 < local_174 + 0x67eefff9) && (local_174 != 0)) {
                uVar6 = ecatGetText(local_174);
                pcVar10 = "DCM Status: %s (0x%08X)\n";
                CAtEmLogging::LogMsg(pCVar9,"DCM Status: %s (0x%08X)\n",uVar6,(ulong)local_174);
              }
              iVar1 = (int)local_160;
              if (cVar13 == '\0') {
                pcVar10 = "DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d";
                CAtEmLogging::LogMsg
                          (S_poLog,"DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d",(ulong)local_16c,
                           (ulong)local_170,(ulong)local_154);
                iVar1 = (int)local_160;
              }
            }
            else {
              iVar1 = emGetMasterState(0);
              if (iVar1 != 8) {
                iVar4 = emGetMasterState(0);
                iVar1 = 0;
                if (iVar4 != 4) goto LAB_0014533e;
              }
              pCVar9 = S_poLog;
              uVar6 = ecatGetText(uVar2);
              pcVar10 = "Cannot get DCM status! %s (0x%08X)\n";
              CAtEmLogging::LogError
                        (pCVar9,"Cannot get DCM status! %s (0x%08X)\n",uVar6,(ulong)uVar2);
              iVar1 = 0;
            }
LAB_0014533e:
            if (eDcmMode == eDcmMode_Dcx) {
              local_148 = 0;
              pcVar10 = (char *)&local_174;
              uVar2 = emDcxGetStatus(0,pcVar10,&local_16c,&local_170,&local_154,&local_148);
              pCVar9 = S_poLog;
              if (uVar2 == 0) {
                if ((int)local_160 != 0) {
                  iVar4 = emGetMasterState(0);
                  uVar2 = iVar4 - 1;
                  if ((uVar2 < 8) && ((0x8fU >> (uVar2 & 0x1f) & 1) != 0)) {
                    pcVar8 = (&PTR_anon_var_dwarf_d20_0023e180)[uVar2];
                  }
                  else {
                    pcVar8 = "STATE INVALID";
                    if (iVar4 == 0) {
                      pcVar8 = "UNKNOWN";
                    }
                  }
                  pcVar10 = "DCX during startup (<INIT> to <%s>)";
                  CAtEmLogging::LogMsg(pCVar9,"DCX during startup (<INIT> to <%s>)",pcVar8);
                }
                pCVar9 = S_poLog;
                if ((1 < local_174 + 0x67eefff9) && (local_174 != 0)) {
                  uVar6 = ecatGetText(local_174);
                  pcVar10 = "DCX Status: %s (0x%08X)\n";
                  CAtEmLogging::LogMsg(pCVar9,"DCX Status: %s (0x%08X)\n",uVar6,(ulong)local_174);
                }
                if (cVar13 == '\0') {
                  pcVar10 = "DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d";
                  CAtEmLogging::LogMsg
                            (S_poLog,"DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d",
                             (ulong)local_16c,(ulong)local_170,(ulong)local_154,local_148);
                }
              }
              else {
                iVar1 = emGetMasterState(0);
                if (iVar1 != 8) {
                  iVar1 = 0;
                  iVar4 = emGetMasterState(0);
                  if (iVar4 != 4) goto LAB_0014547e;
                }
                pCVar9 = S_poLog;
                uVar6 = ecatGetText(uVar2);
                iVar1 = 0;
                pcVar10 = "Cannot get DCX status! %s (0x%08X)\n";
                CAtEmLogging::LogError
                          (pCVar9,"Cannot get DCX status! %s (0x%08X)\n",uVar6,(ulong)uVar2);
              }
            }
LAB_0014547e:
            pCVar5 = local_168;
            if (iVar1 != 0) {
              local_160 = (EC_T_PBYTE)((ulong)local_160 & 0xffffffff00000000);
              emDcmResetStatus(0);
              pCVar5 = local_168;
            }
          }
          CEmNotification::ProcessNotificationJobs(pCVar5);
          poLog_00 = (EC_T_TSC_MEAS_DESC *)0x5;
          LinuxSleep();
        } while (bRun != 0);
      }
      if (S_bEnaPerfJobs == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = 0;
        CAtEmLogging::LogMsg(S_poLog,"");
        CAtEmLogging::LogMsg(S_poLog,"Job times before shutdown");
        ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
      }
    }
    else {
      myAppSetup(poLog,nVerbose,S_dwClntId);
      uVar2 = emSetMasterState(0,15000,4);
      CEmNotification::ProcessNotificationJobs(pCVar5);
      pCVar9 = S_poLog;
      if (uVar2 == 0) {
        pcVar10 = (char *)0x3a98;
        uVar2 = emSetMasterState(0,15000,8);
        uVar11 = (ulong)uVar2;
        poLog_00 = (EC_T_TSC_MEAS_DESC *)pCVar5;
        CEmNotification::ProcessNotificationJobs(pCVar5);
        pCVar9 = S_poLog;
        if (uVar2 != 0) {
          uVar6 = ecatGetText(uVar2);
          pcVar10 = "Cannot start set master state to OP (Result = %s (0x%lx))";
          goto LAB_00144f35;
        }
        goto LAB_00145068;
      }
      uVar6 = ecatGetText(uVar2);
      CAtEmLogging::LogError
                (pCVar9,"Cannot start set master state to SAFEOP (Result = %s (0x%lx))",uVar6,
                 (ulong)uVar2);
      pCVar5 = local_168;
      if (eDcmMode != eDcmMode_Off) {
        local_148 = local_148 & 0xffffffff00000000;
        local_174 = 0;
        local_16c = 0;
        local_170 = 0;
        uVar2 = emDcmGetStatus(0);
        pCVar9 = S_poLog;
        if (uVar2 == 0) {
          pCVar5 = local_168;
          if ((EC_T_DWORD)local_148 == 0) goto LAB_00144d6e;
          uVar6 = ecatGetText((EC_T_DWORD)local_148);
          pcVar10 = "DCM Status: %s (0x%08X)\n";
          uVar3 = (EC_T_DWORD)local_148;
        }
        else {
          uVar6 = ecatGetText(uVar2);
          pcVar10 = "Cannot get DCM status! %s (0x%08X)\n";
          uVar3 = uVar2;
        }
        CAtEmLogging::LogError(pCVar9,pcVar10,uVar6,(ulong)uVar3);
        pCVar5 = local_168;
      }
    }
  }
  else {
    uVar6 = ecatGetText(uVar2);
    pcVar10 = "Cannot start set master state to INIT (Result = %s (0x%lx))";
LAB_00144f35:
    uVar2 = (uint)uVar11;
    CAtEmLogging::LogError(pCVar9,pcVar10,uVar6,uVar11);
  }
LAB_00144d6e:
LAB_001446bc:
  if (nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"========================");
    CAtEmLogging::LogMsg(S_poLog,"Shutdown EtherCAT Master");
    CAtEmLogging::LogMsg(S_poLog,"========================");
  }
  uVar3 = emSetMasterState(0,15000,1);
  pCVar9 = S_poLog;
  if (uVar3 != 0) {
    uVar6 = ecatGetText(uVar3);
    CAtEmLogging::LogError(pCVar9,"Cannot stop EtherCAT-Master! %s (0x%lx)",uVar6,(ulong)uVar3);
  }
  if (S_dwClntId != 0) {
    uVar3 = emUnregisterClient(0);
    pCVar9 = S_poLog;
    if (uVar3 != 0) {
      uVar6 = ecatGetText(uVar3);
      CAtEmLogging::LogError(pCVar9,"Cannot unregister client! %s (0x%lx)",uVar6,(ulong)uVar3);
    }
    S_dwClntId = 0;
  }
  S_DemoThreadParam.bJobThreadShutdown = 1;
  CEcTimer::Start((CEcTimer *)local_b8,2000);
  if (S_DemoThreadParam.bJobThreadRunning != 0) {
    do {
      iVar1 = CEcTimer::IsElapsed((CEcTimer *)local_b8);
      if (iVar1 != 0) break;
      LinuxSleep(10);
    } while (S_DemoThreadParam.bJobThreadRunning != 0);
  }
  if (S_pvtJobThread != (EC_T_PVOID)0x0) {
    OsDeleteThreadHandle();
    S_pvtJobThread = (EC_T_PVOID)0x0;
  }
  if (S_bRasSrvStarted == '\x01') {
    CAtEmLogging::LogMsg(S_poLog,"Stop Remote Api Server\n");
    iVar1 = emRasSrvStop(S_pvRemoteApiSrvH,2000);
    if (iVar1 != 0) {
      CAtEmLogging::LogError(S_poLog,"Remote API Server shutdown failed\n");
    }
  }
  CAtEmLogging::LogMsg(S_poLog,"ecatDeinitMaster() should be called here.");
  CAtEmLogging::LogMsg
            (S_poLog,"But this would provoke a \' double free or corruption (out):\' error.");
  pCVar9 = S_poLog;
  if (uVar3 != 0) {
    uVar6 = ecatGetText(uVar3);
    CAtEmLogging::LogError
              (pCVar9,"Cannot de-initialize EtherCAT-Master! %s (0x%lx)",uVar6,(ulong)uVar3);
  }
  if (S_bEnaPerfJobs != 0) {
    ecatPerfMeasDeinit(&S_TscMeasDesc);
  }
  if (pCVar5 != (CEmNotification *)0x0) {
    operator_delete(pCVar5);
  }
  return uVar2;
}

Assistant:

EC_T_DWORD EtherCATStack(
    CAtEmLogging*       poLog
   ,EC_T_CNF_TYPE       eCnfType                /* [in] Enum type of configuration data provided */
   ,EC_T_PBYTE          pbyCnfData              /* [in] Configuration data */                      
   ,EC_T_DWORD          dwCnfDataLen            /* [in] Length of configuration data in byte */    
   ,EC_T_DWORD          dwBusCycleTimeUsec      /* [in]  bus cycle time in usec */
   ,EC_T_INT            nVerbose                /* [in]  verbosity level */
   ,EC_T_DWORD          dwDuration              /* [in]  test duration in msec (0 = forever) */
   ,EC_T_LINK_PARMS*    poLinkParms             /* [in]  pointer to link parameter */
   ,EC_T_VOID*          pvTimingEvent           /* [in]  Timing event handle */
   ,EC_T_DWORD          dwCpuIndex              /* [in]  SMP only: CPU index */
   ,EC_T_BOOL           bEnaPerfJobs            /* [in]  Performance measurement */
#ifdef ATEMRAS_SERVER 
   ,EC_T_WORD           wServerPort             /* [in]   Remote API Server Port */
#endif
   ,EC_T_LINK_PARMS*    poLinkParmsRed          /* [in]  Redundancy Link Layer Parameter */
   ,EC_T_OS_PARMS*      poOsParms               /* [in]  pointer to OS parameters  */
   ,EC_T_DCM_MODE       eDcmMode                /* [in]  DCM mode */
   ,EC_T_BOOL           bDcmCtlOff              /* [in]  Disables / Enables the control loop for diagnosis */
   ,void (*callbackFctPtr)(EC_T_BYTE*, EC_T_BYTE*)
   ,char*				licenseKey
)
{
	
	callbackFct = callbackFctPtr;
    EC_T_DWORD       dwRetVal = EC_E_NOERROR;
    EC_T_DWORD       dwRes    = EC_E_NOERROR;
    EC_T_BOOL        bRes     = EC_FALSE;
    CEcTimer         oTimeout;
    CEmNotification* pNotification = EC_NULL;
    CEcTimer         oDcmStatusTimer;
    EC_T_BOOL        bFirstDcmStatus = EC_TRUE;
    EC_T_INT         nDcmCtlSetVal = ((dwBusCycleTimeUsec*2)/3)*1000; /* set value in nanosec, 66% of the bus cycle */

    /* store parameters */
    S_poLog = poLog;
    S_bEnaPerfJobs = bEnaPerfJobs;
    S_DemoThreadParam.pvTimingEvent = pvTimingEvent;

	LogMsg("nVerbose: %d\n", nVerbose);
    /* check if interrupt mode is selected */
    if (poLinkParms->eLinkMode != EcLinkMode_POLLING)
    {
        dwRetVal = EC_E_INVALIDPARM;
        LogError("Error: Link layer in 'interrupt' mode is not supported by EcMasterDemoDc. Please select 'polling' mode.");
        goto Exit;
    }
    /* set thread affinity */
    {
        EC_T_CPUSET CpuSet;

        EC_CPUSET_ZERO(CpuSet);
        EC_CPUSET_SET(CpuSet, dwCpuIndex);
        bRes = OsSetThreadAffinity(EC_NULL, CpuSet);
        if (!bRes)
        {
            dwRetVal = EC_E_INVALIDPARM;
            LogError("Error: Set thread affinitiy, invalid CPU index %d\n", dwCpuIndex);
            goto Exit;
        }
    }
    /* create notification context */
    pNotification = EC_NEW(CEmNotification(INSTANCE_MASTER_DEFAULT, poLog));
    if (EC_NULL == pNotification)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    pNotification->Verbose(nVerbose);

    if (S_bEnaPerfJobs)
    {
        PERF_MEASURE_JOBS_INIT(EC_NULL);
    }
    
    /* Demo code: Remove/change this in your application: Initialize application */
    /*****************************************************************************/
    dwRes = myAppInit(poLog, nVerbose);
    if (EC_E_NOERROR != dwRes)
    {
        LogError( (EC_T_CHAR*)"myAppInit failed, error code: 0x%x", dwRes );
        dwRetVal = dwRes;
        goto Exit;
    }
#ifdef ATEMRAS_SERVER
    /*******************************/
    /* Start RAS server if enabled */
    /*******************************/
    if (0xFFFF != wServerPort)
    {
        ATEMRAS_T_SRVPARMS oRemoteApiConfig;

        OsMemset(&oRemoteApiConfig, 0, sizeof(ATEMRAS_T_SRVPARMS));
        oRemoteApiConfig.oAddr.dwAddr       = 0;                    /* INADDR_ANY */
        oRemoteApiConfig.wPort              = wServerPort;
        oRemoteApiConfig.dwCycleTime        = REMOTE_CYCLE_TIME;    /* 2 msec */
        oRemoteApiConfig.dwWDTOLimit        = (REMOTE_WD_TO_LIMIT/REMOTE_CYCLE_TIME); /* WD Timeout after 10secs */
        oRemoteApiConfig.dwReConTOLimit     = 6000;                 /* Reconnect Timeout after 6000*2msec + 10secs */
        oRemoteApiConfig.dwMasterPrio       = MAIN_THREAD_PRIO;
        oRemoteApiConfig.dwClientPrio       = MAIN_THREAD_PRIO;
        oRemoteApiConfig.pvNotifCtxt        = pNotification;        /* Notification context */
        oRemoteApiConfig.pfNotification     = RasNotifyWrapper;     /* Notification function for emras Layer */
        oRemoteApiConfig.dwConcNotifyAmount = 100;                  /* for the first pre-allocate 100 Notification spaces */
        oRemoteApiConfig.dwMbxNotifyAmount  = 50;                   /* for the first pre-allocate 50 Notification spaces */
        oRemoteApiConfig.dwMbxUsrNotifySize = 3000;                 /* 3K user space for Mailbox Notifications */
        oRemoteApiConfig.dwCycErrInterval   = 500;                  /* span between to consecutive cyclic notifications of same type */
        if (0 != nVerbose) LogMsg("Start Remote API Server now\n");
        dwRes = emRasSrvStart(oRemoteApiConfig, &S_pvRemoteApiSrvH);
        if (EC_E_NOERROR != dwRes)
        {
            LogError("ERROR: Cannot spawn Remote API Server\n");
        }
        S_bRasSrvStarted = EC_TRUE;
    }
#endif
    /******************************/
    /* Initialize EtherCAT master */
    /******************************/
    if (0 != nVerbose) LogMsg( "==========================" );
    if (0 != nVerbose) LogMsg( "Initialize EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "==========================" );
    {
        EC_T_INIT_MASTER_PARMS oInitParms;

        OsMemset(&oInitParms, 0, sizeof(EC_T_INIT_MASTER_PARMS));
        oInitParms.dwSignature                   = ATECAT_SIGNATURE;
        oInitParms.dwSize                        = sizeof(EC_T_INIT_MASTER_PARMS);
        oInitParms.pLinkParms                    = poLinkParms;
        oInitParms.pLinkParmsRed                 = poLinkParmsRed;
        oInitParms.dwBusCycleTimeUsec            = dwBusCycleTimeUsec;
        oInitParms.dwMaxBusSlaves                = MASTER_CFG_ECAT_MAX_BUS_SLAVES;
        oInitParms.dwMaxQueuedEthFrames          = MASTER_CFG_MAX_QUEUED_ETH_FRAMES;
        oInitParms.dwMaxSlaveCmdPerFrame         = MASTER_CFG_MAX_SLAVECMD_PER_FRAME;
        if (dwBusCycleTimeUsec < 1000)
        {
            oInitParms.dwMaxSentQueuedFramesPerCycle = 1;
        }
        else
        {
            oInitParms.dwMaxSentQueuedFramesPerCycle = MASTER_CFG_MAX_SENT_QUFRM_PER_CYC;
        }
        oInitParms.dwEcatCmdMaxRetries           = MASTER_CFG_ECAT_CMD_MAX_RETRIES;
        oInitParms.dwEoETimeout                  = MASTER_CFG_EOE_TIMEOUT;
        oInitParms.dwFoEBusyTimeout              = MASTER_CFG_FOE_BUSY_TIMEOUT;
        oInitParms.dwLogLevel                    = nVerbose;
        oInitParms.pfLogMsgCallBack              = CAtEmLogging::OsDbgMsgHookWrapper;
        oInitParms.pOsParms                      = poOsParms;
        dwRes = ecatInitMaster(&oInitParms);        
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            LogError("Cannot initialize EtherCAT-Master! (Result = %s 0x%x)", ecatGetText(dwRes), dwRes);
            goto Exit;
        }
        
        if (strlen(licenseKey) > 1) {
			LogMsg("LicenseKey: %s",licenseKey);
			dwRes = ecatSetLicenseKey(licenseKey);
			if (EC_E_NOERROR == dwRes) LogMsg("ACTIVATION SUCCESSFULL");
			else 	 					LogError("ACTIVATION FAILED (Result = %s 0x%x)", ecatGetText(dwRes), dwRes);
		}
    }
    
    /* Create cyclic task to trigger master jobs */
    /*********************************************/
    S_DemoThreadParam.bJobThreadRunning  = EC_FALSE;
    S_DemoThreadParam.bJobThreadShutdown = EC_FALSE;
    S_DemoThreadParam.pLogInst           = S_poLog;
    S_DemoThreadParam.pNotInst           = pNotification;
    S_DemoThreadParam.dwCpuIndex         = dwCpuIndex;
    S_DemoThreadParam.dwBusCycleTimeUsec = dwBusCycleTimeUsec;
    S_pvtJobThread = OsCreateThread((EC_T_CHAR*)"tEcJobTask", tEcJobTask,
#if !(defined EC_VERSION_GO32)
                                    JOBS_THREAD_PRIO,
#else
                                    dwBusCycleTimeUsec,
#endif
                                    JOBS_THREAD_STACKSIZE, (EC_T_VOID*)&S_DemoThreadParam);
#ifdef RTAI
    OsMakeThreadPeriodic(S_pvtJobThread, dwBusCycleTimeUsec);
#endif
    /* wait until thread is running */
    oTimeout.Start(2000);
    while (!oTimeout.IsElapsed() && !S_DemoThreadParam.bJobThreadRunning)
    {
        OsSleep(10);
    }
    if (!S_DemoThreadParam.bJobThreadRunning)
    {
        dwRetVal = EC_E_TIMEOUT;
        LogError("Timeout starting JobTask");
        goto Exit;
    }
    oTimeout.Stop();

    /* Configure master */
    dwRes = ecatConfigureMaster(eCnfType, pbyCnfData, dwCnfDataLen);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        LogError("Cannot configure EtherCAT-Master! %s (Result = 0x%x)", ecatGetText(dwRes), dwRes);
        goto Exit;
    }
    /* configure DC/DCM if master is started with ENI */
    if (pbyCnfData != EC_NULL)
    {
        /* configure DC */
        {
            EC_T_DC_CONFIGURE oDcConfigure;

            OsMemset(&oDcConfigure, 0, sizeof(EC_T_DC_CONFIGURE));
            oDcConfigure.dwTimeout          = ETHERCAT_DC_TIMEOUT;
            oDcConfigure.dwDevLimit         = ETHERCAT_DC_DEV_LIMIT;
            oDcConfigure.dwSettleTime       = ETHERCAT_DC_SETTLE_TIME;
            if (eDcmMode_MasterRefClock == eDcmMode)
            {
                oDcConfigure.dwTotalBurstLength = 10000; 
                oDcConfigure.dwBurstBulk        = 1;
            }
            else
            {
                oDcConfigure.dwTotalBurstLength = ETHERCAT_DC_ARMW_BURSTCYCLES; 
                if (dwBusCycleTimeUsec < 1000)
                {
                    /* if the cycle time is below 1000 usec, we have to reduce the number of frames sent within one cycle */
                    oDcConfigure.dwBurstBulk = ETHERCAT_DC_ARMW_BURSTSPP / 2;
                }
                else
                {
                    oDcConfigure.dwBurstBulk = ETHERCAT_DC_ARMW_BURSTSPP;
                }
            }
            if (eDcmMode_Dcx == eDcmMode)
            {
                oDcConfigure.bAcycDistributionDisabled = EC_FALSE; /* Enable acyclic distribution if cycle time is above 1000 usec to get DCX in sync */
            }
            else
            {
                oDcConfigure.bAcycDistributionDisabled = EC_TRUE;
            }
            dwRes = ecatDcConfigure(&oDcConfigure);
            if (dwRes != EC_E_NOERROR )
            {
                dwRetVal = dwRes;
                LogError("Cannot configure DC! (Result = 0x%x)", dwRes);
                goto Exit;
            }
        }
        /* configure DCM */
        {
            EC_T_DCM_CONFIG oDcmConfig;
            EC_T_BOOL       bLogEnabled = EC_FALSE;
#ifdef DCM_ENABLE_LOGFILE
            if (pNotification->Verbose() >= 3)
            {
                bLogEnabled = EC_TRUE;
            }
#endif
            if (bDcmCtlOff)
            {
                if (0 != nVerbose) LogMsg("DCM control loop disabled for diagnosis!\n");
            }
            OsMemset(&oDcmConfig, 0, sizeof(EC_T_DCM_CONFIG));
            switch (eDcmMode)
            {
            case eDcmMode_Off:
                oDcmConfig.eMode = eDcmMode_Off;
                break;
            case eDcmMode_BusShift:
                oDcmConfig.eMode = eDcmMode_BusShift;
                oDcmConfig.u.BusShift.nCtlSetVal    = nDcmCtlSetVal;
                oDcmConfig.u.BusShift.dwInSyncLimit = (dwBusCycleTimeUsec*1000)/5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.BusShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.BusShift.bCtlOff = bDcmCtlOff;
                break;
             case eDcmMode_MasterShift:
                oDcmConfig.eMode = eDcmMode_MasterShift;
                oDcmConfig.u.MasterShift.nCtlSetVal    = nDcmCtlSetVal;
                oDcmConfig.u.MasterShift.dwInSyncLimit = (dwBusCycleTimeUsec*1000)/5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.MasterShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.MasterShift.bCtlOff = bDcmCtlOff;
                break;
            case eDcmMode_MasterRefClock:
                oDcmConfig.eMode = eDcmMode_MasterRefClock;
                oDcmConfig.u.MasterRefClock.nCtlSetVal  = nDcmCtlSetVal;
                oDcmConfig.u.MasterRefClock.bLogEnabled = bLogEnabled;
                break;
            case eDcmMode_Dcx:
                oDcmConfig.eMode = eDcmMode_Dcx;
                /* Mastershift */
                oDcmConfig.u.Dcx.MasterShift.nCtlSetVal = nDcmCtlSetVal;
                oDcmConfig.u.Dcx.MasterShift.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.Dcx.MasterShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.Dcx.MasterShift.bCtlOff = bDcmCtlOff;
                /* Dcx Busshift */
                oDcmConfig.u.Dcx.nCtlSetVal = nDcmCtlSetVal;
                oDcmConfig.u.Dcx.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 50;   /* 2 % limit in nsec for InSync monitoring */
                oDcmConfig.u.Dcx.bLogEnabled = bLogEnabled;
                oDcmConfig.u.Dcx.bCtlOff = bDcmCtlOff;
                oDcmConfig.u.Dcx.dwExtClockTimeout = 1000;
                oDcmConfig.u.Dcx.wExtClockFixedAddr = 0; /* 0 only when clock adjustment in external mode configured by EcEngineer */
                break;
            default:
                dwRetVal = EC_E_NOTSUPPORTED;
                LogError("DCM mode is not supported!");
                goto Exit;

            }
            dwRes = ecatDcmConfigure(&oDcmConfig, 0);
            switch (dwRes)
            {
            case EC_E_NOERROR:
                break;
            case EC_E_FEATURE_DISABLED:
                LogError("Cannot configure DCM mode!");
                LogError("Start with -dcmmode off to run the DC demo without DCM, or prepare the ENI file to support the requested DCM mode");
                LogError("In ET9000 for example, select under ""Advanced settings\\Distributed clocks"" ""DC in use"" and ""Slave Mode""");
                LogError("to support BusShift and MasterRefClock modes.");
                LogError("Please refer to the class A manual for further information");
                dwRetVal = dwRes;
                goto Exit;
            default:
                LogError("Cannot configure DCM mode! %s (Result = 0x%x)", ecatGetText(dwRes), dwRes);
                dwRetVal = dwRes;
                goto Exit;
            }
        }
    }
    /* Register client */
    {
        EC_T_REGISTERRESULTS oRegisterResults;

        OsMemset(&oRegisterResults, 0, sizeof(EC_T_REGISTERRESULTS));
        dwRes = ecatRegisterClient(ecatNotifyCallback, pNotification, &oRegisterResults);
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            LogError("Cannot register client! (Result = 0x%x)", dwRes);
            goto Exit;
        }
        S_dwClntId = oRegisterResults.dwClntId;
        pNotification->SetClientID(S_dwClntId);
    }
    
    /* Print found slaves */
    if (nVerbose >= 2)
    {
        dwRes = ecatScanBus(ETHERCAT_SCANBUS_TIMEOUT);
        switch (dwRes)
        {
        case EC_E_NOERROR:
        case EC_E_BUSCONFIG_MISMATCH:
        case EC_E_LINE_CROSSED:
            PrintSlaveInfos(INSTANCE_MASTER_DEFAULT, poLog);
            break;
        default:
            LogError("Cannot scan bus: %s (0x%lx)", ecatGetText(dwRes), dwRes);
            break;
        }
    }

    /* Print MAC address */
    if (nVerbose > 0)
    {
        ETHERNET_ADDRESS oSrcMacAddress;

        dwRes = ecatGetSrcMacAddress(&oSrcMacAddress);
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot get MAC address! (Result = 0x%x)", dwRes);
        }
        LogMsg("EtherCAT network adapter MAC: %02X-%02X-%02X-%02X-%02X-%02X\n",
            oSrcMacAddress.b[0], oSrcMacAddress.b[1], oSrcMacAddress.b[2], oSrcMacAddress.b[3], oSrcMacAddress.b[4], oSrcMacAddress.b[5]);
    }
    
    /* Start EtherCAT bus --> set Master state to OPERATIONAL if ENI file provided */
    /*******************************************************************************/
    if (0 != nVerbose) LogMsg( "=====================" );
    if (0 != nVerbose) LogMsg( "Start EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "=====================" );

    /* set master and bus state to INIT */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_INIT);
    pNotification->ProcessNotificationJobs();
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot start set master state to INIT (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }

    /******************************************************/
    /* Demo code: Remove/change this in your application  */
    /******************************************************/
    dwRes = myAppPrepare(poLog, nVerbose);
    if (EC_E_NOERROR != dwRes)
    {
        LogError((EC_T_CHAR*)"myAppPrepare failed, error code: 0x%x", dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }
    /* set master and bus state to PREOP */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_PREOP);
    pNotification->ProcessNotificationJobs();
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot start set master state to PREOP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }
    /* skip this step if demo started without ENI */
    if (pbyCnfData != EC_NULL)
    {
        /******************************************************/
        /* Demo code: Remove/change this in your application  */
        /******************************************************/
        dwRes = myAppSetup(poLog, nVerbose, S_dwClntId);
        if (EC_E_NOERROR != dwRes)
        {
            LogError((EC_T_CHAR*)"myAppSetup failed, error code: 0x%x", dwRes);
            dwRetVal = dwRes;
            goto Exit;
        }
        /* set master and bus state to SAFEOP */
        dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_SAFEOP);
        pNotification->ProcessNotificationJobs();
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot start set master state to SAFEOP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);

            /* most of the time SAFEOP is not reachable due to DCM */
            if (eDcmMode_Off != eDcmMode)
            {
            EC_T_DWORD dwDcmStatus = 0;
            EC_T_INT   nDiffCur = 0, nDiffAvg = 0, nDiffMax = 0;

                dwRes = ecatDcmGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax);
                if (dwRes == EC_E_NOERROR)
                {
                    if (dwDcmStatus != EC_E_NOERROR)
                    {
                        LogError("DCM Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                    }
                }
                else
                {
                    LogError("Cannot get DCM status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                }
            }
            dwRetVal = dwRes;
            goto Exit;
        }
        /* set master and bus state to OP */
        dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_OP);
        pNotification->ProcessNotificationJobs();
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot start set master state to OP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
            dwRetVal = dwRes;
            goto Exit;
        }
    }
    else
    {
        if (0 != nVerbose) LogMsg("No ENI file provided. EC-Master started with generated ENI file.");
    }

    if (S_bEnaPerfJobs)
    {
        LogMsg("");
        LogMsg("Job times during startup <INIT> to <%s>:", ecatStateToStr(ecatGetMasterState()));
        PERF_MEASURE_JOBS_SHOW();       /* show job times */
        LogMsg("");
        ecatPerfMeasReset(&S_TscMeasDesc, 0xFFFFFFFF);        /* clear job times of startup phase */
    }

#if (defined DEBUG) && (defined XENOMAI)
    /* Enabling mode switch warnings for shadowed task */
    dwRes = rt_task_set_mode(0, T_WARNSW, NULL);
    if (0 != dwRes)
    {
        OsDbgMsg("EnableRealtimeEnvironment: rt_task_set_mode returned an error\n");
        OsDbgAssert(EC_FALSE);
    }
#endif

    /* run the demo */
    if (dwDuration != 0)
    {
        oTimeout.Start(dwDuration);
    }
    while (bRun && (!oTimeout.IsStarted() || !oTimeout.IsElapsed()))
    {
        if (nVerbose >= 2)
        {
            PERF_MEASURE_JOBS_SHOW();       /* show job times */
        }
        bRun = !OsTerminateAppRequest();/* check if demo shall terminate */

        /*****************************************************************************************/
        /* Demo code: Remove/change this in your application: Do some diagnosis outside job task */
        /*****************************************************************************************/
        myAppDiagnosis(poLog, nVerbose);

        /* check DCM status if master is started with ENI */
        if (pbyCnfData != EC_NULL)
        {
            if (eDcmMode_Off != eDcmMode)
            {
            EC_T_DWORD dwDcmStatus = 0;
            EC_T_INT   nDiffCur = 0, nDiffAvg = 0, nDiffMax = 0;
            EC_T_BOOL  bLogDcmStatus = EC_FALSE;
            EC_T_BOOL  bResetDcmStatus = bFirstDcmStatus;

                if (!oDcmStatusTimer.IsStarted() || oDcmStatusTimer.IsElapsed())
                {
                    oDcmStatusTimer.Start(5000);
                    if (nVerbose >= 3)
                    {
                        bLogDcmStatus = EC_TRUE;
                    }
                }
                dwRes = ecatDcmGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax);
                if (dwRes == EC_E_NOERROR)
                {
                    if (bFirstDcmStatus)
                    {
                        LogMsg("DCM during startup (<INIT> to <%s>)", ecatStateToStr(ecatGetMasterState()));
                    }
                    if ((dwDcmStatus != EC_E_NOTREADY) && (dwDcmStatus != EC_E_BUSY) && (dwDcmStatus != EC_E_NOERROR))
                    {
                        LogMsg("DCM Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                    }
                    if (bLogDcmStatus)
                    {
                        LogMsg("DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d", nDiffCur, nDiffAvg, nDiffMax);
                    }
                }
                else
                {
                    if ((eEcatState_OP == ecatGetMasterState()) || (eEcatState_SAFEOP == ecatGetMasterState()))
                    {
                        LogError("Cannot get DCM status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                    }
                    bResetDcmStatus = EC_FALSE;
                }
                if (eDcmMode_Dcx == eDcmMode)
                {
                EC_T_INT64 nTimeStampDiff = 0;

                    dwRes = ecatDcxGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax, &nTimeStampDiff);
                    if (EC_E_NOERROR == dwRes)
                    {
                        if (bFirstDcmStatus)
                        {
                            LogMsg("DCX during startup (<INIT> to <%s>)", ecatStateToStr(ecatGetMasterState()));
                        }
                        if ((dwDcmStatus != EC_E_NOTREADY) && (dwDcmStatus != EC_E_BUSY) && (dwDcmStatus != EC_E_NOERROR))
                        {
                            LogMsg("DCX Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                        }
                        if (bLogDcmStatus)
                        {
                            LogMsg("DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d", nDiffCur, nDiffAvg, nDiffMax, nTimeStampDiff);
                        }
                    }
                    else
                    {
                        if ((eEcatState_OP == ecatGetMasterState()) || (eEcatState_SAFEOP == ecatGetMasterState()))
                        {
                            LogError("Cannot get DCX status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                        }
                        bResetDcmStatus = EC_FALSE;
                    }
                }
                if (bResetDcmStatus)
                {
#if (defined ATECAT_VERSION) && (ATECAT_VERSION >= 0x02040106)
                    ecatDcmResetStatus();
#endif
                    bFirstDcmStatus = EC_FALSE;
                }
            }
        }
        /* process notification jobs */
        pNotification->ProcessNotificationJobs();

        OsSleep(5);
    }

    if (S_bEnaPerfJobs)
    {
        LogMsg("");
        LogMsg("Job times before shutdown");
        PERF_MEASURE_JOBS_SHOW();       /* show job times */
    }

Exit:
    if (0 != nVerbose) LogMsg( "========================" );
    if (0 != nVerbose) LogMsg( "Shutdown EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "========================" );

    /* Stop EtherCAT bus --> Set Master state to INIT */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_INIT);
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot stop EtherCAT-Master! %s (0x%lx)", ecatGetText(dwRes), dwRes);
    }
    /* Unregister client */
    if (S_dwClntId != 0)
    {
        dwRes = ecatUnregisterClient(S_dwClntId); 
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot unregister client! %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        S_dwClntId = 0;
    }

#if (defined DEBUG) && (defined XENOMAI)
    /* Disable PRIMARY to SECONDARY MODE switch warning */
    dwRes = rt_task_set_mode(T_WARNSW, 0, NULL);
    if (dwRes != 0)
    {
        OsDbgMsg("OsCreateThread: rt_task_set_mode returned error %d\n", dwRes);
        OsDbgAssert(EC_FALSE);
    }
#endif /* XENOMAI */

    /* Shutdown tEcJobTask */
    S_DemoThreadParam.bJobThreadShutdown = EC_TRUE;
    oTimeout.Start(2000);
    while (S_DemoThreadParam.bJobThreadRunning && !oTimeout.IsElapsed())
    {
        OsSleep(10);
    }
    if (S_pvtJobThread != EC_NULL)
    {
        OsDeleteThreadHandle(S_pvtJobThread);
        S_pvtJobThread = EC_NULL;
    }

#ifdef ATEMRAS_SERVER
    /* Stop RAS server */
    if (S_bRasSrvStarted)
    {
        LogMsg("Stop Remote Api Server\n");
        
        if (EC_E_NOERROR != emRasSrvStop(S_pvRemoteApiSrvH, 2000))
        {
            LogError("Remote API Server shutdown failed\n");
        }
    }
#endif

    /* Deinitialize master */
    LogMsg( "ecatDeinitMaster() should be called here." );
    LogMsg( "But this would provoke a ' double free or corruption (out):' error." );
//     dwRes = ecatDeinitMaster();
    
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot de-initialize EtherCAT-Master! %s (0x%lx)", ecatGetText(dwRes), dwRes);
    }

    if (S_bEnaPerfJobs)
    {
        PERF_MEASURE_JOBS_DEINIT();
    }
    /* delete notification context */
    SafeDelete(pNotification);

    return dwRetVal;
}